

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O1

size_t __thiscall notch::io::IDXReader::readDims(IDXReader *this,istream *in)

{
  uint in_EAX;
  runtime_error *this_00;
  char magic [4];
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  std::istream::read((char *)in,(long)&uStack_18 + 4);
  if (*(long *)(in + 8) == 4) {
    if (uStack_18._5_1_ == '\0' && uStack_18._4_1_ == '\0') {
      if (uStack_18._6_1_ == '\b') {
        if (0xfb < (byte)(uStack_18._7_1_ - 5)) {
          return (ulong)uStack_18._7_1_;
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"IDXReader: unsupported number of dimensions");
      }
      else {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"IDXReader: unsupported IDX type code");
      }
    }
    else {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"IDXReader: not an IDX magic");
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"IDXReader cannot read magic");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t readDims(std::istream &in) {
        char magic[4] = { 0, 0, 0, 0};
        in.read(magic, 4);
        size_t n = in.gcount();
        for (size_t i = 0; i<4; ++i)
        if (n != 4) {
            throw std::runtime_error("IDXReader cannot read magic");
        }
        if (magic[0] != 0 || magic[1] != 0) {
            throw std::runtime_error("IDXReader: not an IDX magic");
        }
        char typecode = magic[2];
        if (typecode != 0x08) { // unsigned byte
            throw std::runtime_error("IDXReader: unsupported IDX type code");
        }
        char dims = magic[3];
        if (dims > maxDims || dims <= 0) {
            throw std::runtime_error("IDXReader: unsupported number of dimensions");
        }
        return dims;
    }